

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *io1;
  TValue *io;
  TValue k;
  StkId t;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  k._8_8_ = index2addr(L,idx);
  k.value_.b = 2;
  pTVar1 = L->top;
  io = (TValue *)p;
  pTVar3 = luaH_get((Table *)(((TValue *)k._8_8_)->value_).gc,(TValue *)&io);
  pTVar1->value_ = pTVar3->value_;
  uVar2 = *(undefined4 *)&pTVar3->field_0xc;
  pTVar1->tt_ = pTVar3->tt_;
  *(undefined4 *)&pTVar1->field_0xc = uVar2;
  L->top = L->top + 1;
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  StkId t;
  TValue k;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setpvalue(&k, cast(void *, p));
  setobj2s(L, L->top, luaH_get(hvalue(t), &k));
  api_incr_top(L);
  lua_unlock(L);
  return ttnov(L->top - 1);
}